

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

int set_cache_A_multi_record(cache *Cache,char *label,void **data,int size)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&Cache->lock);
  iVar1 = _set_cache_A_multi_record(Cache,label,data,size);
  pthread_mutex_unlock((pthread_mutex_t *)&Cache->lock);
  return iVar1;
}

Assistant:

int _set_cache_A_multi_record(cache*Cache,const char *label, void*data[],int size) {
  if(Cache->is_init==false){
    log_error("cache not init");
    return -1;
  }
  struct record* record = push_front(Cache,label);//预留空间
  // log_info("%lld\n",record);
  if(record){
    #ifdef LOG_INCLUDED
    log_debug("set cache ;label= %s",label);
    #endif 
    if(record->size>0){
      #ifdef LOG_INCLUDED
      log_debug("length>0");
      #endif
      Cache->realse(record);
    }
    Cache->add_multi(record,data,size);
    //       {
    //   bool is_find;
    //   printf("label = %s %s",label,Cache->get_label(record));
    //   get_hashnode(&Cache->label_hash,Cache->get_label(record),&is_find);
    //   if(is_find){
    //     printf("ok");
    //   }else{
    //     printf("error");
    //     exit(0);
    //   }
    // }
    return 1;
  }else{
    return 0;
  }
}